

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O2

Type * __thiscall
spvtools::opt::CombineAccessChains::GetIndexedType(CombineAccessChains *this,Instruction *inst)

{
  uint32_t uVar1;
  int iVar2;
  DefUseManager *this_00;
  TypeManager *this_01;
  Instruction *pIVar3;
  Type *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConstantManager *this_02;
  Constant *constant_inst;
  uint32_t i;
  uint index;
  uint32_t index_value;
  Type *local_58;
  TypeManager *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_indices;
  
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  this_01 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = Instruction::GetSingleWordInOperand(inst,0);
  pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar1);
  uVar1 = Instruction::type_id(pIVar3);
  local_50 = this_01;
  pTVar4 = analysis::TypeManager::GetType(this_01,uVar1);
  iVar2 = (*pTVar4->_vptr_Type[0x22])(pTVar4);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    __assert_fail("type->AsPointer()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/combine_access_chains.cpp"
                  ,0x62,
                  "const analysis::Type *spvtools::opt::CombineAccessChains::GetIndexedType(Instruction *)"
                 );
  }
  iVar2 = (*pTVar4->_vptr_Type[0x22])(pTVar4);
  local_58 = *(Type **)(CONCAT44(extraout_var_00,iVar2) + 0x28);
  element_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  element_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  element_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index = (uint)(inst->opcode_ == OpInBoundsPtrAccessChain || inst->opcode_ == OpPtrAccessChain);
  while( true ) {
    index = index + 1;
    uVar1 = Instruction::NumInOperands(inst);
    if (uVar1 <= index) break;
    uVar1 = Instruction::GetSingleWordInOperand(inst,index);
    pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar1);
    this_02 = IRContext::get_constant_mgr((this->super_Pass).context_);
    constant_inst = analysis::ConstantManager::GetConstantFromInst(this_02,pIVar3);
    if (constant_inst == (Constant *)0x0) {
      index_value = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&element_indices,&index_value);
    }
    else {
      index_value = GetConstantValue((CombineAccessChains *)this_02,constant_inst);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&element_indices,&index_value);
    }
  }
  pTVar4 = analysis::TypeManager::GetMemberType
                     (local_50,local_58,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &element_indices.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&element_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return pTVar4;
}

Assistant:

const analysis::Type* CombineAccessChains::GetIndexedType(Instruction* inst) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();

  Instruction* base_ptr = def_use_mgr->GetDef(inst->GetSingleWordInOperand(0));
  const analysis::Type* type = type_mgr->GetType(base_ptr->type_id());
  assert(type->AsPointer());
  type = type->AsPointer()->pointee_type();
  std::vector<uint32_t> element_indices;
  uint32_t starting_index = 1;
  if (IsPtrAccessChain(inst->opcode())) {
    // Skip the first index of OpPtrAccessChain as it does not affect type
    // resolution.
    starting_index = 2;
  }
  for (uint32_t i = starting_index; i < inst->NumInOperands(); ++i) {
    Instruction* index_inst =
        def_use_mgr->GetDef(inst->GetSingleWordInOperand(i));
    const analysis::Constant* index_constant =
        context()->get_constant_mgr()->GetConstantFromInst(index_inst);
    if (index_constant) {
      uint32_t index_value = GetConstantValue(index_constant);
      element_indices.push_back(index_value);
    } else {
      // This index must not matter to resolve the type in valid SPIR-V.
      element_indices.push_back(0);
    }
  }
  type = type_mgr->GetMemberType(type, element_indices);
  return type;
}